

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.h
# Opt level: O0

void __thiscall
cm::uv_handle_ptr_base_<uv_signal_s>::~uv_handle_ptr_base_(uv_handle_ptr_base_<uv_signal_s> *this)

{
  uv_handle_ptr_base_<uv_signal_s> *this_local;
  
  reset(this);
  std::shared_ptr<uv_signal_s>::~shared_ptr(&this->handle);
  return;
}

Assistant:

~uv_handle_ptr_base_() { reset(); }